

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O2

RunnerContext * SetNodeValue(Runner *runner,ASTNode *node)

{
  Token TVar1;
  ASTNode *pAVar2;
  uint uVar3;
  void *__ptr;
  RunnerContext *pRVar4;
  RunnerContext *pRVar5;
  ulong uVar6;
  ulong uVar7;
  void *callstack [128];
  undefined1 auStack_428 [1024];
  
  if (node == (ASTNode *)0x0) {
    uVar6 = 0;
    printf("Invalid Check: %s in %s:%d\n","node != NULL","SetNodeValue",0xaa);
    uVar3 = backtrace(auStack_428,0x80);
    __ptr = (void *)backtrace_symbols(auStack_428,uVar3);
    uVar7 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar7 = uVar6;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      puts(*(char **)((long)__ptr + uVar6 * 8));
    }
    free(__ptr);
  }
  pRVar4 = GetContextByNodeId(runner,node->id);
  if (pRVar4 != (RunnerContext *)0x0) {
    return pRVar4;
  }
  pRVar4 = GetNextContext(runner);
  pRVar4->node = node;
  TVar1 = node->type;
  switch(TVar1) {
  case BOOLEAN:
    pRVar4->dataType = BOOLEAN;
    goto LAB_00105e0d;
  case BYTE:
    pRVar4->dataType = BYTE;
    goto LAB_00105e0d;
  case SHORT:
    pRVar4->dataType = SHORT;
    (pRVar4->value).vShort = (node->meta).shortExpr.value;
    break;
  case INT:
    pRVar4->dataType = INT;
    (pRVar4->value).vInt = (node->meta).intExpr.value;
    break;
  case FLOAT:
    pRVar4->dataType = FLOAT;
    (pRVar4->value).vInt = (node->meta).intExpr.value;
    break;
  case DOUBLE:
    pRVar4->dataType = DOUBLE;
    pRVar4->value = (anon_union_8_9_f6e6a019_for_value)(node->meta).doubleExpr.value;
    break;
  case LONG:
    pRVar4->dataType = LONG;
    goto LAB_00105df8;
  case END_NUMBER:
  case BEGIN_STRING:
    break;
  case CHAR:
    pRVar4->dataType = CHAR;
LAB_00105e0d:
    (pRVar4->value).vBoolean = (node->meta).booleanExpr.value;
    break;
  case STRING:
    pRVar4->dataType = STRING;
LAB_00105df8:
    pRVar4->value = (anon_union_8_9_f6e6a019_for_value)(node->meta).doubleExpr.value;
    break;
  default:
    if (TVar1 == VAR) {
      RunSetVarType(runner,pRVar4,node);
    }
    else if (TVar1 == FUNC_CALL) {
      pAVar2 = runner->currentNode;
      runner->currentNode = node;
      pRVar5 = RunFuncCall(runner);
      runner->currentNode = pAVar2;
      pRVar4->dataType = pRVar5->dataType;
      pRVar4->value = pRVar5->value;
      runner->contextUsed[(long)pRVar5->id + -1] = false;
      pRVar5->node = (ASTNode *)0x0;
      pRVar5->dataType = UNDEFINED;
    }
  }
  return pRVar4;
}

Assistant:

RunnerContext* SetNodeValue(Runner* runner, ASTNode* node){
  CHECK(node != NULL);
  RunnerContext* context = GetContextByNodeId(runner, node->id);
  if (context != NULL){
    return context;
  }

  context = GetNextContext(runner);
  context->node = node;

  int type = (int) node->type;
  switch (type) {
    case BOOLEAN: {
      context->dataType = node->type;
      context->value.vBoolean = GET_BOOLEAN_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %d\n", context->value.vBoolean);
      break;
    }
    case BYTE: {
      context->dataType = BYTE;
      context->value.vByte = GET_BYTE_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %d\n", context->value.vByte);
      break;
    }
    case SHORT: {
      context->dataType = SHORT;
      context->value.vShort = GET_SHORT_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %d\n", context->value.vShort);
      break;
    }
    case INT: {
      context->dataType = INT;
      context->value.vInt = GET_INT_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %d\n", context->value.vInt);
      break;
    }
    case FLOAT: {
      context->dataType = FLOAT;
      context->value.vFloat = GET_FLOAT_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %f\n", context->value.vFloat);
      break;
    }
    case DOUBLE: {
      context->dataType = DOUBLE;
      context->value.vDouble = GET_DOUBLE_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %f\n", context->value.vDouble);
      break;
    }
    case LONG: {
      context->dataType = LONG;
      context->value.vLong = GET_LONG_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %ld\n", context->value.vLong);
      break;
    }
    case CHAR: {
      context->dataType = CHAR;
      context->value.vChar = GET_CHAR_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %c\n", context->value.vChar);
      break;
    }
    case STRING: {
      context->dataType = STRING;
      context->value.vString = GET_STRING_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %s\n", context->value.vString);
      break;
    }
    case VAR: {
      RunSetVarType(runner, context, node);
      break;
    }
    case FUNC_CALL: {
      ASTNode* previousNode = runner->currentNode;
      runner->currentNode = node;
      RunnerContext* newContext = RunFuncCall(runner);
      runner->currentNode = previousNode;
      MergeContextValues(newContext, context);
      GCContext(runner, newContext);
      break;
    }
  }

  return context;
}